

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O1

QString * FileHdrWrapper::translateMachine(DWORD val)

{
  Data *pDVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_color in_ESI;
  QString *in_RDI;
  bool bVar5;
  QByteArrayView QVar6;
  _Rb_tree_color local_34;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  local_34 = in_ESI;
  if (s_machine._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    initMachine();
  }
  p_Var4 = &s_machine._M_t._M_impl.super__Rb_tree_header._M_header;
  if (s_machine._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var4 = &s_machine._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = s_machine._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      bVar5 = p_Var3[1]._M_color < local_34;
      if (!bVar5) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar5];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var4 == &s_machine._M_t._M_impl.super__Rb_tree_header) ||
     (local_34 < p_Var4[1]._M_color)) {
    QVar6.m_data = (storage_type *)0x0;
    QVar6.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar6);
    (in_RDI->d).size = 0;
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char16_t *)0x0;
    (in_RDI->d).d = local_30;
    (in_RDI->d).ptr = local_28;
    (in_RDI->d).size = local_20;
  }
  else {
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_machine,&local_34);
    pDVar1 = (pmVar2->d).d;
    (in_RDI->d).d = pDVar1;
    (in_RDI->d).ptr = (pmVar2->d).ptr;
    (in_RDI->d).size = (pmVar2->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return in_RDI;
}

Assistant:

QString FileHdrWrapper::translateMachine(DWORD val)
{
    if (s_machine.size() == 0) 
        initMachine();

    if (s_machine.find(val) == s_machine.end()) return "";
    return s_machine[val];
}